

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O0

UCPTrie * ucptrie_openFromBinary_63
                    (UCPTrieType type,UCPTrieValueWidth valueWidth,void *data,int32_t length,
                    int32_t *pActualLength,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UCPTrieValueWidth UVar2;
  UCPTrieType UVar3;
  uint uVar4;
  uint16_t *puVar5;
  int local_a4;
  int32_t nullValueOffset;
  uint16_t *p16;
  UCPTrie *trie;
  undefined1 local_88 [4];
  int32_t actualLength;
  UCPTrie tempTrie;
  UCPTrieValueWidth actualValueWidth;
  UCPTrieType actualType;
  int32_t valueWidthInt;
  int32_t typeInt;
  int32_t options;
  UCPTrieHeader *header;
  UErrorCode *pErrorCode_local;
  int32_t *pActualLength_local;
  int32_t length_local;
  void *data_local;
  UCPTrieValueWidth valueWidth_local;
  UCPTrieType type_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((((length < 1) || (((ulong)data & 3) != 0)) || (type < UCPTRIE_TYPE_ANY)) ||
        ((UCPTRIE_TYPE_SMALL < type || (valueWidth < UCPTRIE_VALUE_BITS_ANY)))) ||
       (UCPTRIE_VALUE_BITS_8 < valueWidth)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      _valueWidth_local = (UCPTrie *)0x0;
    }
    else if (length < 0x10) {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      _valueWidth_local = (UCPTrie *)0x0;
    }
    else if (*data == 0x54726933) {
      UVar2 = (UCPTrieValueWidth)*(ushort *)((long)data + 4);
      UVar3 = UVar2 >> 6 & 3;
      tempTrie.nullValue = UVar2 & 7;
      if ((((uint)UVar3 < 2) && (tempTrie.nullValue < 3)) &&
         ((*(ushort *)((long)data + 4) & 0x38) == 0)) {
        data_local._4_4_ = type;
        if (type < UCPTRIE_TYPE_FAST) {
          data_local._4_4_ = UVar3;
        }
        data_local._0_4_ = valueWidth;
        if (valueWidth < UCPTRIE_VALUE_BITS_16) {
          data_local._0_4_ = tempTrie.nullValue;
        }
        if ((data_local._4_4_ == UVar3) && ((UCPTrieValueWidth)data_local == tempTrie.nullValue)) {
          memset(local_88,0,0x30);
          tempTrie.data._0_4_ = ZEXT24(*(ushort *)((long)data + 6));
          tempTrie.data._4_4_ = (UVar2 & 0xf000) << 4 | (uint)*(ushort *)((long)data + 8);
          tempTrie._30_2_ = *(undefined2 *)((long)data + 10);
          tempTrie.reserved32 = (UVar2 & 0xf00) << 8 | (uint)*(ushort *)((long)data + 0xc);
          tempTrie.indexLength = (uint)*(ushort *)((long)data + 0xe) * 0x200;
          tempTrie.dataLength._0_2_ = (undefined2)(tempTrie.indexLength + 0xfff >> 0xc);
          tempTrie.dataLength._2_1_ = (undefined1)data_local._4_4_;
          tempTrie.dataLength._3_1_ = (undefined1)(UCPTrieValueWidth)data_local;
          if ((UCPTrieValueWidth)data_local == UCPTRIE_VALUE_BITS_16) {
            uVar4 = tempTrie.data._4_4_ * 2;
          }
          else {
            uVar4 = tempTrie.data._4_4_;
            if ((UCPTrieValueWidth)data_local == UCPTRIE_VALUE_BITS_32) {
              uVar4 = tempTrie.data._4_4_ * 4;
            }
          }
          trie._4_4_ = uVar4 + tempTrie.data._0_4_ * 2 + 0x10;
          if (length < trie._4_4_) {
            *pErrorCode = U_INVALID_FORMAT_ERROR;
            _valueWidth_local = (UCPTrie *)0x0;
          }
          else {
            _valueWidth_local = (UCPTrie *)uprv_malloc_63(0x30);
            if (_valueWidth_local == (UCPTrie *)0x0) {
              *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
              _valueWidth_local = (UCPTrie *)0x0;
            }
            else {
              memcpy(_valueWidth_local,local_88,0x30);
              _valueWidth_local->index = (uint16_t *)((long)data + 0x10);
              puVar5 = (uint16_t *)((long)data + 0x10) + _valueWidth_local->indexLength;
              local_a4 = _valueWidth_local->dataNullOffset;
              if (_valueWidth_local->dataLength <= local_a4) {
                local_a4 = _valueWidth_local->dataLength + -2;
              }
              if ((UCPTrieValueWidth)data_local == UCPTRIE_VALUE_BITS_16) {
                (_valueWidth_local->data).ptr0 = puVar5;
                _valueWidth_local->nullValue =
                     (uint)*(ushort *)((long)(_valueWidth_local->data).ptr0 + (long)local_a4 * 2);
              }
              else if ((UCPTrieValueWidth)data_local == UCPTRIE_VALUE_BITS_32) {
                (_valueWidth_local->data).ptr0 = puVar5;
                _valueWidth_local->nullValue =
                     *(uint32_t *)((long)(_valueWidth_local->data).ptr0 + (long)local_a4 * 4);
              }
              else {
                if ((UCPTrieValueWidth)data_local != UCPTRIE_VALUE_BITS_8) {
                  *pErrorCode = U_INVALID_FORMAT_ERROR;
                  return (UCPTrie *)0x0;
                }
                (_valueWidth_local->data).ptr0 = puVar5;
                _valueWidth_local->nullValue =
                     (uint)*(byte *)((long)(_valueWidth_local->data).ptr0 + (long)local_a4);
              }
              if (pActualLength != (int32_t *)0x0) {
                *pActualLength = trie._4_4_;
              }
            }
          }
        }
        else {
          *pErrorCode = U_INVALID_FORMAT_ERROR;
          _valueWidth_local = (UCPTrie *)0x0;
        }
      }
      else {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        _valueWidth_local = (UCPTrie *)0x0;
      }
    }
    else {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      _valueWidth_local = (UCPTrie *)0x0;
    }
  }
  else {
    _valueWidth_local = (UCPTrie *)0x0;
  }
  return _valueWidth_local;
}

Assistant:

U_CAPI UCPTrie * U_EXPORT2
ucptrie_openFromBinary(UCPTrieType type, UCPTrieValueWidth valueWidth,
                       const void *data, int32_t length, int32_t *pActualLength,
                       UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }

    if (length <= 0 || (U_POINTER_MASK_LSB(data, 3) != 0) ||
            type < UCPTRIE_TYPE_ANY || UCPTRIE_TYPE_SMALL < type ||
            valueWidth < UCPTRIE_VALUE_BITS_ANY || UCPTRIE_VALUE_BITS_8 < valueWidth) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return nullptr;
    }

    // Enough data for a trie header?
    if (length < (int32_t)sizeof(UCPTrieHeader)) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        return nullptr;
    }

    // Check the signature.
    const UCPTrieHeader *header = (const UCPTrieHeader *)data;
    if (header->signature != UCPTRIE_SIG) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        return nullptr;
    }

    int32_t options = header->options;
    int32_t typeInt = (options >> 6) & 3;
    int32_t valueWidthInt = options & UCPTRIE_OPTIONS_VALUE_BITS_MASK;
    if (typeInt > UCPTRIE_TYPE_SMALL || valueWidthInt > UCPTRIE_VALUE_BITS_8 ||
            (options & UCPTRIE_OPTIONS_RESERVED_MASK) != 0) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        return nullptr;
    }
    UCPTrieType actualType = (UCPTrieType)typeInt;
    UCPTrieValueWidth actualValueWidth = (UCPTrieValueWidth)valueWidthInt;
    if (type < 0) {
        type = actualType;
    }
    if (valueWidth < 0) {
        valueWidth = actualValueWidth;
    }
    if (type != actualType || valueWidth != actualValueWidth) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        return nullptr;
    }

    // Get the length values and offsets.
    UCPTrie tempTrie;
    uprv_memset(&tempTrie, 0, sizeof(tempTrie));
    tempTrie.indexLength = header->indexLength;
    tempTrie.dataLength =
        ((options & UCPTRIE_OPTIONS_DATA_LENGTH_MASK) << 4) | header->dataLength;
    tempTrie.index3NullOffset = header->index3NullOffset;
    tempTrie.dataNullOffset =
        ((options & UCPTRIE_OPTIONS_DATA_NULL_OFFSET_MASK) << 8) | header->dataNullOffset;

    tempTrie.highStart = header->shiftedHighStart << UCPTRIE_SHIFT_2;
    tempTrie.shifted12HighStart = (tempTrie.highStart + 0xfff) >> 12;
    tempTrie.type = type;
    tempTrie.valueWidth = valueWidth;

    // Calculate the actual length.
    int32_t actualLength = (int32_t)sizeof(UCPTrieHeader) + tempTrie.indexLength * 2;
    if (valueWidth == UCPTRIE_VALUE_BITS_16) {
        actualLength += tempTrie.dataLength * 2;
    } else if (valueWidth == UCPTRIE_VALUE_BITS_32) {
        actualLength += tempTrie.dataLength * 4;
    } else {
        actualLength += tempTrie.dataLength;
    }
    if (length < actualLength) {
        *pErrorCode = U_INVALID_FORMAT_ERROR;  // Not enough bytes.
        return nullptr;
    }

    // Allocate the trie.
    UCPTrie *trie = (UCPTrie *)uprv_malloc(sizeof(UCPTrie));
    if (trie == nullptr) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    uprv_memcpy(trie, &tempTrie, sizeof(tempTrie));
#ifdef UCPTRIE_DEBUG
    trie->name = "fromSerialized";
#endif

    // Set the pointers to its index and data arrays.
    const uint16_t *p16 = (const uint16_t *)(header + 1);
    trie->index = p16;
    p16 += trie->indexLength;

    // Get the data.
    int32_t nullValueOffset = trie->dataNullOffset;
    if (nullValueOffset >= trie->dataLength) {
        nullValueOffset = trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET;
    }
    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        trie->data.ptr16 = p16;
        trie->nullValue = trie->data.ptr16[nullValueOffset];
        break;
    case UCPTRIE_VALUE_BITS_32:
        trie->data.ptr32 = (const uint32_t *)p16;
        trie->nullValue = trie->data.ptr32[nullValueOffset];
        break;
    case UCPTRIE_VALUE_BITS_8:
        trie->data.ptr8 = (const uint8_t *)p16;
        trie->nullValue = trie->data.ptr8[nullValueOffset];
        break;
    default:
        // Unreachable because valueWidth was checked above.
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        return nullptr;
    }

    if (pActualLength != nullptr) {
        *pActualLength = actualLength;
    }
    return trie;
}